

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O3

void __thiscall QEglFSKmsGbmScreen::resetSurface(QEglFSKmsGbmScreen *this)

{
  bool bVar1;
  
  this->m_flipPending = false;
  this->m_gbm_surface = (gbm_surface *)0x0;
  this->m_gbm_bo_current = (gbm_bo *)0x0;
  bVar1 = QKmsDevice::hasAtomicSupport(*(QKmsDevice **)&this->field_0x28);
  if (!bVar1) {
    this->needsNewModeSetForNextFb = true;
  }
  return;
}

Assistant:

void QEglFSKmsGbmScreen::resetSurface()
{
    m_flipPending = false; // not necessarily true but enough to keep bo_next
    m_gbm_bo_current = nullptr;
    m_gbm_surface = nullptr;

    // Leave m_gbm_bo_next untouched. waitForFlip() should
    // still do its work, when called. Otherwise we end up
    // in device-is-busy errors if there is a new QWindow
    // created afterwards. (QTBUG-122663)

    // If not using atomic, will need a new drmModeSetCrtc if a new window
    // gets created later on (and so there's a new fb).
    if (!device()->hasAtomicSupport())
        needsNewModeSetForNextFb = true;
}